

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

FunctionInfo *
Js::DynamicProfileInfo::GetFunctionInfo
          (FunctionBody *functionBody,SourceId sourceId,LocalFunctionId functionId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  Utf8SourceInfo *pUVar6;
  FunctionBody *pFVar7;
  ScriptContext *pSVar8;
  SourceList *pSVar9;
  Type *pTVar10;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar11;
  DWORD_PTR DVar12;
  FunctionInfo *pFVar13;
  FunctionInfo *local_80;
  FunctionBody *local_70;
  FunctionProxy *inlineeProxy_2;
  Utf8SourceInfo *srcInfo_1;
  int i_1;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *sourceList_1;
  FunctionProxy *inlineeProxy_1;
  Utf8SourceInfo *srcInfo;
  int i;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *sourceList;
  FunctionProxy *inlineeProxy;
  LocalFunctionId functionId_local;
  SourceId sourceId_local;
  FunctionBody *functionBody_local;
  
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x413,"(ThreadContext::GetContextForCurrentThread())",
                                "ThreadContext::GetContextForCurrentThread()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (sourceId == 0xfffffffe) {
    functionBody_local = (FunctionBody *)JavascriptBuiltInFunction::GetFunctionInfo(functionId);
  }
  else if (sourceId == 0xfffffffd) {
    pUVar6 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)functionBody);
    pFVar7 = Utf8SourceInfo::FindFunction(pUVar6,functionId);
    if (pFVar7 == (FunctionBody *)0x0) {
      local_70 = (FunctionBody *)0x0;
    }
    else {
      local_70 = (FunctionBody *)FunctionProxy::GetFunctionInfo((FunctionProxy *)pFVar7);
    }
    functionBody_local = local_70;
  }
  else {
    if (sourceId == 0xfffffffb) {
      pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pSVar9 = ScriptContext::GetSourceList(pSVar8);
      for (srcInfo._4_4_ = 0;
          iVar3 = JsUtil::
                  ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                  ::Count(&pSVar9->
                           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ), srcInfo._4_4_ < iVar3; srcInfo._4_4_ = srcInfo._4_4_ + 1) {
        bVar2 = JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                ::IsItemValid(pSVar9,srcInfo._4_4_);
        if (bVar2) {
          pTVar10 = JsUtil::
                    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    ::Item(pSVar9,srcInfo._4_4_);
          pRVar11 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_>::
                    operator->(pTVar10);
          pUVar6 = Memory::RecyclerWeakReference<Js::Utf8SourceInfo>::Get(pRVar11);
          if ((pUVar6 != (Utf8SourceInfo *)0x0) &&
             (DVar12 = Utf8SourceInfo::GetHostSourceContext(pUVar6), DVar12 == 0xfffffffffffffffe))
          {
            pFVar7 = Utf8SourceInfo::FindFunction(pUVar6,functionId);
            if (pFVar7 != (FunctionBody *)0x0) {
              pFVar13 = FunctionProxy::GetFunctionInfo((FunctionProxy *)pFVar7);
              return pFVar13;
            }
            return (FunctionInfo *)0x0;
          }
        }
      }
    }
    if ((sourceId != 0xffffffff) && (sourceId != 0xfffffffc)) {
      pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pSVar9 = ScriptContext::GetSourceList(pSVar8);
      for (srcInfo_1._4_4_ = 0;
          iVar3 = JsUtil::
                  ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                  ::Count(&pSVar9->
                           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ), srcInfo_1._4_4_ < iVar3; srcInfo_1._4_4_ = srcInfo_1._4_4_ + 1) {
        bVar2 = JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                ::IsItemValid(pSVar9,srcInfo_1._4_4_);
        if (bVar2) {
          pTVar10 = JsUtil::
                    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    ::Item(pSVar9,srcInfo_1._4_4_);
          pRVar11 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_>::
                    operator->(pTVar10);
          pUVar6 = Memory::RecyclerWeakReference<Js::Utf8SourceInfo>::Get(pRVar11);
          if ((pUVar6 != (Utf8SourceInfo *)0x0) &&
             (DVar12 = Utf8SourceInfo::GetHostSourceContext(pUVar6), DVar12 == sourceId)) {
            pFVar7 = Utf8SourceInfo::FindFunction(pUVar6,functionId);
            if (pFVar7 == (FunctionBody *)0x0) {
              local_80 = (FunctionInfo *)0x0;
            }
            else {
              local_80 = FunctionProxy::GetFunctionInfo((FunctionProxy *)pFVar7);
            }
            return local_80;
          }
        }
      }
    }
    functionBody_local = (FunctionBody *)0x0;
  }
  return (FunctionInfo *)functionBody_local;
}

Assistant:

FunctionInfo * DynamicProfileInfo::GetFunctionInfo(FunctionBody* functionBody, Js::SourceId sourceId, Js::LocalFunctionId functionId)
    {
        Assert(ThreadContext::GetContextForCurrentThread());
        if (sourceId == BuiltInSourceId)
        {
            return JavascriptBuiltInFunction::GetFunctionInfo(functionId);
        }

        if (sourceId == CurrentSourceId) // caller and callee in same file
        {
            FunctionProxy *inlineeProxy = functionBody->GetUtf8SourceInfo()->FindFunction(functionId);
            return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
        }

        if (sourceId == JsBuiltInSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == Js::Constants::JsBuiltInSourceContext)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        if (inlineeProxy)
                        {
                            return inlineeProxy->GetFunctionInfo();
                        }
                        else
                        {
                            return nullptr;
                        }
                    }
                }
            }
        }

        if (sourceId != NoSourceId && sourceId != InvalidSourceId)
        {
            // For call across files find the function from the right source
            JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> * sourceList = functionBody->GetScriptContext()->GetSourceList();
            for (int i = 0; i < sourceList->Count(); i++)
            {
                if (sourceList->IsItemValid(i))
                {
                    Utf8SourceInfo *srcInfo = sourceList->Item(i)->Get();
                    if (srcInfo && srcInfo->GetHostSourceContext() == sourceId)
                    {
                        FunctionProxy *inlineeProxy = srcInfo->FindFunction(functionId);
                        return inlineeProxy ? inlineeProxy->GetFunctionInfo() : nullptr;
                    }
                }
            }
        }

        return nullptr;
    }